

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::zeromq::ZmqCommsSS,_helics::CommonCore>::CommsBroker
          (CommsBroker<helics::zeromq::ZmqCommsSS,_helics::CommonCore> *this,bool arg)

{
  undefined8 *in_RDI;
  bool in_stack_0000000f;
  CommonCore *in_stack_00000010;
  CommsBroker<helics::zeromq::ZmqCommsSS,_helics::CommonCore> *in_stack_00000070;
  __integral_type_conflict in_stack_ffffffffffffffdc;
  undefined1 __i;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  
  CommonCore::CommonCore(in_stack_00000010,in_stack_0000000f);
  *in_RDI = &PTR__CommsBroker_00932e80;
  in_RDI[1] = &PTR__CommsBroker_00933218;
  uVar1 = 0;
  std::atomic<int>::atomic
            ((atomic<int> *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  __i = (undefined1)((uint)in_stack_ffffffffffffffdc >> 0x18);
  std::unique_ptr<helics::zeromq::ZmqCommsSS,std::default_delete<helics::zeromq::ZmqCommsSS>>::
  unique_ptr<std::default_delete<helics::zeromq::ZmqCommsSS>,void>
            ((unique_ptr<helics::zeromq::ZmqCommsSS,_std::default_delete<helics::zeromq::ZmqCommsSS>_>
              *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  std::atomic<bool>::atomic((atomic<bool> *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),(bool)__i);
  loadComms(in_stack_00000070);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker(bool arg) noexcept: BrokerT(arg)
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}